

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DeadBranchElimPass::SimplifyBranch
          (DeadBranchElimPass *this,BasicBlock *block,uint32_t live_lab_id)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t loop_merge_id;
  uint32_t loop_continue_id;
  uint32_t switch_merge_id;
  Instruction *this_00;
  Instruction *pIVar4;
  Operand *__x;
  IRContext *pIVar5;
  IRContext *this_01;
  BasicBlock *block_00;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_d8;
  Instruction *local_d0;
  Instruction *first_break;
  StructuredCFGAnalysis *cfg_analysis;
  iterator local_b8;
  undefined8 local_b0;
  SmallVector<unsigned_int,_2UL> local_a8;
  Operand local_80;
  undefined1 local_50 [8];
  OperandList new_operands;
  Instruction *terminator;
  Instruction *merge_inst;
  uint32_t live_lab_id_local;
  BasicBlock *block_local;
  DeadBranchElimPass *this_local;
  
  this_00 = BasicBlock::GetMergeInst(block);
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)BasicBlock::terminator(block);
  if ((this_00 == (Instruction *)0x0) ||
     (OVar2 = Instruction::opcode(this_00), OVar2 != OpSelectionMerge)) {
    AddBranch(this,live_lab_id,block);
    pIVar5 = Pass::context((Pass *)this);
    IRContext::KillInst(pIVar5,(Instruction *)
                               new_operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    pIVar4 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                       (&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    OVar2 = Instruction::opcode(pIVar4);
    if (OVar2 == OpSwitch) {
      uVar3 = BasicBlock::id(block);
      bVar1 = SwitchHasNestedBreak(this,uVar3);
      if (bVar1) {
        uVar3 = Instruction::NumInOperands
                          ((Instruction *)
                           new_operands.
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (uVar3 != 2) {
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_50);
          __x = Instruction::GetInOperand
                          ((Instruction *)
                           new_operands.
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_50,__x);
          local_b8 = (iterator)((long)&cfg_analysis + 4);
          local_b0 = 1;
          init_list._M_len = 1;
          init_list._M_array = local_b8;
          cfg_analysis._4_4_ = live_lab_id;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8,init_list);
          Operand::Operand(&local_80,SPV_OPERAND_TYPE_ID,&local_a8);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_50,&local_80);
          Operand::~Operand(&local_80);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8);
          Instruction::SetInOperands
                    ((Instruction *)
                     new_operands.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(OperandList *)local_50);
          pIVar5 = Pass::context((Pass *)this);
          IRContext::UpdateDefUse
                    (pIVar5,(Instruction *)
                            new_operands.
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_50);
          return true;
        }
        return false;
      }
    }
    pIVar5 = Pass::context((Pass *)this);
    first_break = (Instruction *)IRContext::GetStructuredCFGAnalysis(pIVar5);
    uVar3 = Instruction::GetSingleWordInOperand(this_00,0);
    loop_merge_id =
         StructuredCFGAnalysis::LoopMergeBlock((StructuredCFGAnalysis *)first_break,live_lab_id);
    loop_continue_id =
         StructuredCFGAnalysis::LoopContinueBlock((StructuredCFGAnalysis *)first_break,live_lab_id);
    switch_merge_id =
         StructuredCFGAnalysis::SwitchMergeBlock((StructuredCFGAnalysis *)first_break,live_lab_id);
    local_d0 = FindFirstExitFromSelectionMerge
                         (this,live_lab_id,uVar3,loop_merge_id,loop_continue_id,switch_merge_id);
    AddBranch(this,live_lab_id,block);
    pIVar5 = Pass::context((Pass *)this);
    IRContext::KillInst(pIVar5,(Instruction *)
                               new_operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_d0 == (Instruction *)0x0) {
      pIVar5 = Pass::context((Pass *)this);
      IRContext::KillInst(pIVar5,this_00);
    }
    else {
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
                (&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      pIVar4 = local_d0;
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_d8,this_00);
      Instruction::InsertBefore(pIVar4,&local_d8);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_d8);
      pIVar5 = Pass::context((Pass *)this);
      this_01 = Pass::context((Pass *)this);
      block_00 = IRContext::get_instr_block(this_01,local_d0);
      IRContext::set_instr_block(pIVar5,this_00,block_00);
    }
  }
  return true;
}

Assistant:

bool DeadBranchElimPass::SimplifyBranch(BasicBlock* block,
                                        uint32_t live_lab_id) {
  Instruction* merge_inst = block->GetMergeInst();
  Instruction* terminator = block->terminator();
  if (merge_inst && merge_inst->opcode() == spv::Op::OpSelectionMerge) {
    if (merge_inst->NextNode()->opcode() == spv::Op::OpSwitch &&
        SwitchHasNestedBreak(block->id())) {
      if (terminator->NumInOperands() == 2) {
        // We cannot remove the branch, and it already has a single case, so no
        // work to do.
        return false;
      }
      // We have to keep the switch because it has a nest break, so we
      // remove all cases except for the live one.
      Instruction::OperandList new_operands;
      new_operands.push_back(terminator->GetInOperand(0));
      new_operands.push_back({SPV_OPERAND_TYPE_ID, {live_lab_id}});
      terminator->SetInOperands(std::move(new_operands));
      context()->UpdateDefUse(terminator);
    } else {
      // Check if the merge instruction is still needed because of a
      // non-nested break from the construct.  Move the merge instruction if
      // it is still needed.
      StructuredCFGAnalysis* cfg_analysis =
          context()->GetStructuredCFGAnalysis();
      Instruction* first_break = FindFirstExitFromSelectionMerge(
          live_lab_id, merge_inst->GetSingleWordInOperand(0),
          cfg_analysis->LoopMergeBlock(live_lab_id),
          cfg_analysis->LoopContinueBlock(live_lab_id),
          cfg_analysis->SwitchMergeBlock(live_lab_id));

      AddBranch(live_lab_id, block);
      context()->KillInst(terminator);
      if (first_break == nullptr) {
        context()->KillInst(merge_inst);
      } else {
        merge_inst->RemoveFromList();
        first_break->InsertBefore(std::unique_ptr<Instruction>(merge_inst));
        context()->set_instr_block(merge_inst,
                                   context()->get_instr_block(first_break));
      }
    }
  } else {
    AddBranch(live_lab_id, block);
    context()->KillInst(terminator);
  }
  return true;
}